

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.h
# Opt level: O3

SurfaceInteraction * __thiscall
pbrt::Disk::InteractionFromIntersection
          (SurfaceInteraction *__return_storage_ptr__,Disk *this,QuadricIntersection *isect,
          Vector3f *wo,Float time)

{
  float fVar1;
  float fVar2;
  bool bVar3;
  bool bVar4;
  Transform *pTVar5;
  undefined1 auVar6 [16];
  float fVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  Tuple3<pbrt::Normal3,_float> local_1e0;
  Tuple3<pbrt::Vector3,_float> local_1d0;
  Vector3f local_1c4;
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [16];
  undefined1 local_198 [16];
  Tuple2<pbrt::Point2,_float> local_188;
  Tuple3<pbrt::Vector3,_float> local_180;
  Tuple3<pbrt::Vector3,_float> local_170;
  Tuple3<pbrt::Normal3,_float> local_160;
  Point3f pHit;
  Point3fi local_140;
  SurfaceInteraction local_128;
  
  pHit.super_Tuple3<pbrt::Point3,_float>.x = (isect->pObj).super_Tuple3<pbrt::Point3,_float>.x;
  pHit.super_Tuple3<pbrt::Point3,_float>.y = (isect->pObj).super_Tuple3<pbrt::Point3,_float>.y;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = pHit.super_Tuple3<pbrt::Point3,_float>._0_8_;
  fVar1 = this->radius;
  local_1c4.super_Tuple3<pbrt::Vector3,_float>.y = this->phiMax;
  auVar6._8_4_ = 0x80000000;
  auVar6._0_8_ = 0x8000000080000000;
  auVar6._12_4_ = 0x80000000;
  auVar8 = vxorps_avx512vl(ZEXT416((uint)local_1c4.super_Tuple3<pbrt::Vector3,_float>.y),auVar6);
  auVar6 = vmovshdup_avx(auVar10);
  fVar7 = this->innerRadius - fVar1;
  local_1b8 = ZEXT416((uint)local_1c4.super_Tuple3<pbrt::Vector3,_float>.y);
  local_1c4.super_Tuple3<pbrt::Vector3,_float>.x = auVar6._0_4_;
  local_198 = ZEXT416((uint)(fVar1 - this->innerRadius));
  local_1e0.x = 0.0;
  local_1e0.y = 0.0;
  local_160.x = 0.0;
  local_160.y = 0.0;
  local_1e0.z = 0.0;
  local_160.z = 0.0;
  auVar6 = vfmadd231ss_fma(ZEXT416((uint)(local_1c4.super_Tuple3<pbrt::Vector3,_float>.x *
                                         local_1c4.super_Tuple3<pbrt::Vector3,_float>.x)),auVar10,
                           auVar10);
  local_1c4.super_Tuple3<pbrt::Vector3,_float>.z = 0.0;
  auVar6 = vsqrtss_avx(auVar6,auVar6);
  local_1d0.z = auVar6._0_4_;
  local_1a8 = vinsertps_avx(ZEXT416((uint)isect->phi),ZEXT416((uint)(fVar1 - local_1d0.z)),0x10);
  local_1c4.super_Tuple3<pbrt::Vector3,_float>.y =
       local_1c4.super_Tuple3<pbrt::Vector3,_float>.y *
       (float)pHit.super_Tuple3<pbrt::Point3,_float>.x;
  local_1c4.super_Tuple3<pbrt::Vector3,_float>.x =
       local_1c4.super_Tuple3<pbrt::Vector3,_float>.x * auVar8._0_4_;
  auVar9._4_4_ = local_1d0.z;
  auVar9._0_4_ = local_1d0.z;
  auVar9._8_4_ = local_1d0.z;
  auVar9._12_4_ = local_1d0.z;
  auVar8._0_4_ = fVar7 * (float)pHit.super_Tuple3<pbrt::Point3,_float>.x;
  auVar8._4_4_ = fVar7 * (float)pHit.super_Tuple3<pbrt::Point3,_float>.y;
  auVar8._8_4_ = fVar7 * 0.0;
  auVar8._12_4_ = fVar7 * 0.0;
  auVar6 = vdivps_avx(auVar8,auVar9);
  local_1d0.z = (fVar7 * 0.0) / local_1d0.z;
  local_1d0._0_8_ = vmovlps_avx(auVar6);
  pHit.super_Tuple3<pbrt::Point3,_float>.z = this->height;
  local_170.x = 0.0;
  local_170.y = 0.0;
  local_170.z = 0.0;
  pTVar5 = this->objectFromRender;
  fVar1 = (wo->super_Tuple3<pbrt::Vector3,_float>).y;
  fVar7 = (wo->super_Tuple3<pbrt::Vector3,_float>).x;
  fVar2 = (wo->super_Tuple3<pbrt::Vector3,_float>).z;
  bVar3 = this->reverseOrientation;
  bVar4 = this->transformSwapsHandedness;
  auVar6 = vfmadd231ss_fma(ZEXT416((uint)(fVar1 * (pTVar5->m).m[0][1])),ZEXT416((uint)fVar7),
                           ZEXT416((uint)(pTVar5->m).m[0][0]));
  auVar8 = vfmadd231ss_fma(ZEXT416((uint)(fVar1 * (pTVar5->m).m[1][1])),ZEXT416((uint)fVar7),
                           ZEXT416((uint)(pTVar5->m).m[1][0]));
  auVar9 = vfmadd231ss_fma(ZEXT416((uint)(fVar1 * (pTVar5->m).m[2][1])),ZEXT416((uint)fVar7),
                           ZEXT416((uint)(pTVar5->m).m[2][0]));
  auVar6 = vfmadd231ss_fma(auVar6,ZEXT416((uint)fVar2),ZEXT416((uint)(pTVar5->m).m[0][2]));
  auVar8 = vfmadd231ss_fma(auVar8,ZEXT416((uint)fVar2),ZEXT416((uint)(pTVar5->m).m[1][2]));
  auVar9 = vfmadd231ss_fma(auVar9,ZEXT416((uint)fVar2),ZEXT416((uint)(pTVar5->m).m[2][2]));
  auVar6 = vinsertps_avx(auVar6,auVar8,0x10);
  local_180._0_8_ = vmovlps_avx(auVar6);
  local_180.z = auVar9._0_4_;
  pTVar5 = this->renderFromObject;
  Point3fi::Point3fi(&local_140,&pHit,(Vector3f *)&local_170);
  auVar6 = vinsertps_avx(local_1b8,ZEXT416((uint)local_198._0_4_),0x10);
  auVar6 = vdivps_avx(local_1a8,auVar6);
  local_188 = (Tuple2<pbrt::Point2,_float>)vmovlps_avx(auVar6);
  SurfaceInteraction::SurfaceInteraction
            (&local_128,&local_140,(Point2f *)&local_188,(Vector3f *)&local_180,&local_1c4,
             (Vector3f *)&local_1d0,(Normal3f *)&local_1e0,(Normal3f *)&local_160,time,
             bVar3 != bVar4);
  Transform::operator()(__return_storage_ptr__,pTVar5,&local_128);
  return __return_storage_ptr__;
}

Assistant:

InteractionFromIntersection(const QuadricIntersection &isect,
                                                   const Vector3f &wo, Float time) const {
        Point3f pHit = isect.pObj;
        Float phi = isect.phi;
        // Find parametric representation of disk hit
        Float u = phi / phiMax;
        Float rHit = std::sqrt(pHit.x * pHit.x + pHit.y * pHit.y);
        Float v = (radius - rHit) / (radius - innerRadius);
        Vector3f dpdu(-phiMax * pHit.y, phiMax * pHit.x, 0);
        Vector3f dpdv = Vector3f(pHit.x, pHit.y, 0.) * (innerRadius - radius) / rHit;
        Normal3f dndu(0, 0, 0), dndv(0, 0, 0);

        // Refine disk intersection point
        pHit.z = height;

        // Compute error bounds for disk intersection
        Vector3f pError(0, 0, 0);

        // Return _SurfaceInteraction_ for quadric intersection
        bool flipNormal = reverseOrientation ^ transformSwapsHandedness;
        Vector3f woObject = (*objectFromRender)(wo);
        return (*renderFromObject)(SurfaceInteraction(Point3fi(pHit, pError),
                                                      Point2f(u, v), woObject, dpdu, dpdv,
                                                      dndu, dndv, time, flipNormal));
    }